

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRotationZ.hpp
# Opt level: O0

void __thiscall
qclab::qgates::CRotationZ<std::complex<float>_>::CRotationZ(CRotationZ<std::complex<float>_> *this)

{
  undefined4 local_14;
  CRotationZ<std::complex<float>_> *local_10;
  CRotationZ<std::complex<float>_> *this_local;
  
  local_10 = this;
  QControlledGate2<std::complex<float>_>::QControlledGate2
            (&this->super_QControlledGate2<std::complex<float>_>,0,1);
  (this->super_QControlledGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_0075b2b8;
  local_14 = 1;
  std::make_unique<qclab::qgates::RotationZ<std::complex<float>>,int,double>
            ((int *)&this->gate_,(double *)&local_14);
  return;
}

Assistant:

CRotationZ()
        : QControlledGate2< T >( 0 )
        , gate_( std::make_unique< RotationZ< T > >( 1 , 0. ) )
        { }